

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall wabt::OptionParser::PrintHelp(OptionParser *this)

{
  ulong *puVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pcVar5;
  Option *option;
  pointer pAVar6;
  pointer pOVar7;
  long *plVar8;
  long *plVar9;
  undefined8 *puVar10;
  char cVar11;
  ulong uVar12;
  ulong uVar13;
  char *__format;
  pointer pOVar14;
  iterator __begin1;
  pointer pOVar15;
  long lVar16;
  __string_type __str;
  string flag;
  string line;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  undefined1 *local_98;
  ulong local_90;
  undefined1 local_88 [16];
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  char *local_58;
  undefined8 local_50;
  char local_48 [16];
  pointer local_38;
  
  printf("usage: %s [options]",(this->program_name_)._M_dataplus._M_p);
  pAVar6 = (this->arguments_).
           super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->arguments_).
      super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar6) {
    lVar16 = 0x20;
    uVar12 = 0;
    do {
      iVar2 = *(int *)((long)&(pAVar6->name)._M_dataplus._M_p + lVar16);
      __format = " %s";
      if (iVar2 == 0) {
LAB_0015c95c:
        printf(__format,*(undefined8 *)((long)pAVar6 + lVar16 + -0x20));
      }
      else if (iVar2 == 1) {
        __format = " %s+";
        goto LAB_0015c95c;
      }
      uVar12 = uVar12 + 1;
      pAVar6 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x50;
    } while (uVar12 < (ulong)(((long)(this->arguments_).
                                     super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6 >> 4)
                             * -0x3333333333333333));
  }
  puts("\n");
  puts((this->description_)._M_dataplus._M_p);
  puts("options:");
  pOVar15 = (this->options_).
            super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar14 = (this->options_).
            super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar15 == pOVar14) {
    cVar11 = '\n';
  }
  else {
    uVar12 = 0;
    pOVar7 = pOVar15;
    do {
      sVar3 = (pOVar7->long_name)._M_string_length;
      if (sVar3 != 0) {
        sVar4 = (pOVar7->metavar)._M_string_length;
        lVar16 = sVar4 + 1;
        if (sVar4 == 0) {
          lVar16 = 0;
        }
        uVar13 = lVar16 + sVar3;
        if (uVar12 < uVar13) {
          uVar12 = uVar13;
        }
      }
      pOVar7 = pOVar7 + 1;
    } while (pOVar7 != pOVar14);
    cVar11 = (char)uVar12 + '\n';
  }
  if (pOVar15 != pOVar14) {
    local_38 = pOVar14;
    do {
      if ((pOVar15->short_name != '\0') || ((pOVar15->long_name)._M_string_length != 0)) {
        local_58 = local_48;
        local_50 = 0;
        local_48[0] = '\0';
        if (pOVar15->short_name == '\0') {
          std::__cxx11::string::append((char *)&local_58);
        }
        else {
          local_98 = local_88;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"  -","");
          plVar8 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_98,local_90,0,'\x01');
          plVar9 = plVar8 + 2;
          if ((long *)*plVar8 == plVar9) {
            local_a8 = *plVar9;
            lStack_a0 = plVar8[3];
            local_b8 = &local_a8;
          }
          else {
            local_a8 = *plVar9;
            local_b8 = (long *)*plVar8;
          }
          local_b0 = plVar8[1];
          *plVar8 = (long)plVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
          puVar1 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar1) {
            local_68 = *puVar1;
            lStack_60 = plVar9[3];
            local_78 = &local_68;
          }
          else {
            local_68 = *puVar1;
            local_78 = (ulong *)*plVar9;
          }
          local_70 = plVar9[1];
          *plVar9 = (long)puVar1;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78);
          if (local_78 != &local_68) {
            operator_delete(local_78);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8);
          }
          if (local_98 != local_88) {
            operator_delete(local_98);
          }
        }
        local_70 = 0;
        local_68 = local_68 & 0xffffffffffffff00;
        local_78 = &local_68;
        if ((pOVar15->long_name)._M_string_length != 0) {
          std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,0x1af86f);
          if ((pOVar15->metavar)._M_string_length == 0) {
            std::__cxx11::string::_M_append
                      ((char *)&local_78,(ulong)(pOVar15->long_name)._M_dataplus._M_p);
          }
          else {
            local_98 = local_88;
            pcVar5 = (pOVar15->long_name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,pcVar5,pcVar5 + (pOVar15->long_name)._M_string_length);
            std::__cxx11::string::_M_replace_aux((ulong)&local_98,local_90,0,'\x01');
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_98,(ulong)(pOVar15->metavar)._M_dataplus._M_p);
            plVar9 = puVar10 + 2;
            if ((long *)*puVar10 == plVar9) {
              local_a8 = *plVar9;
              lStack_a0 = puVar10[3];
              local_b8 = &local_a8;
            }
            else {
              local_a8 = *plVar9;
              local_b8 = (long *)*puVar10;
            }
            local_b0 = puVar10[1];
            *puVar10 = plVar9;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8);
            if (local_b8 != &local_a8) {
              operator_delete(local_b8);
            }
            if (local_98 != local_88) {
              operator_delete(local_98);
            }
          }
        }
        local_98 = local_88;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar11 - (char)local_70);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
        plVar9 = puVar10 + 2;
        if ((long *)*puVar10 == plVar9) {
          local_a8 = *plVar9;
          lStack_a0 = puVar10[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar9;
          local_b8 = (long *)*puVar10;
        }
        local_b0 = puVar10[1];
        *puVar10 = plVar9;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8);
        }
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
        if ((pOVar15->help)._M_string_length != 0) {
          std::__cxx11::string::_M_append((char *)&local_58,(ulong)(pOVar15->help)._M_dataplus._M_p)
          ;
        }
        puts(local_58);
        if (local_78 != &local_68) {
          operator_delete(local_78);
        }
        pOVar14 = local_38;
        if (local_58 != local_48) {
          operator_delete(local_58);
          pOVar14 = local_38;
        }
      }
      pOVar15 = pOVar15 + 1;
    } while (pOVar15 != pOVar14);
  }
  return;
}

Assistant:

void OptionParser::PrintHelp() {
  printf("usage: %s [options]", program_name_.c_str());

  for (size_t i = 0; i < arguments_.size(); ++i) {
    Argument& argument = arguments_[i];
    switch (argument.count) {
      case ArgumentCount::One:
        printf(" %s", argument.name.c_str());
        break;

      case ArgumentCount::OneOrMore:
        printf(" %s+", argument.name.c_str());
        break;
    }
  }

  printf("\n\n");
  printf("%s\n", description_.c_str());
  printf("options:\n");

  const size_t kExtraSpace = 8;
  size_t longest_name_length = 0;
  for (const Option& option : options_) {
    size_t length;
    if (!option.long_name.empty()) {
      length = option.long_name.size();
      if (!option.metavar.empty()) {
        // +1 for '='.
        length += option.metavar.size() + 1;
      }
    } else {
      continue;
    }

    if (length > longest_name_length) {
      longest_name_length = length;
    }
  }

  for (const Option& option : options_) {
    if (!option.short_name && option.long_name.empty()) {
      continue;
    }

    std::string line;
    if (option.short_name) {
      line += std::string("  -") + option.short_name + ", ";
    } else {
      line += "      ";
    }

    std::string flag;
    if (!option.long_name.empty()) {
      flag = "--";
      if (!option.metavar.empty()) {
        flag += option.long_name + '=' + option.metavar;
      } else {
        flag += option.long_name;
      }
    }

    // +2 for "--" of the long flag name.
    size_t remaining = longest_name_length + kExtraSpace + 2 - flag.size();
    line += flag + std::string(remaining, ' ');

    if (!option.help.empty()) {
      line += option.help;
    }
    printf("%s\n", line.c_str());
  }
}